

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::msgpack::basic_msgpack_cursor<jsoncons::bytes_source,_std::allocator<char>_>::reset
          (basic_msgpack_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this)

{
  int iVar1;
  uint6 uStack_26;
  
  basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset(&this->parser_);
  (this->cursor_visitor_).event_.event_type_ = null_value;
  (this->cursor_visitor_).event_.tag_ = none;
  *(ulong *)&(this->cursor_visitor_).event_.field_0x2 = (ulong)uStack_26;
  *(undefined8 *)((long)&(this->cursor_visitor_).event_.ext_tag_ + 2) = 0;
  (this->cursor_visitor_).event_.value_.int64_value_ = 0;
  (this->cursor_visitor_).event_.length_ = 0;
  (this->cursor_visitor_).state_ = 0;
  (this->cursor_visitor_).data_.type_ = 0;
  (this->cursor_visitor_).data_.data_.uint8_data_ = (uint8_t *)0x0;
  (this->cursor_visitor_).data_.size_ = 0;
  (this->cursor_visitor_).shape_.data_ = (pointer)0x0;
  (this->cursor_visitor_).shape_.size_ = 0;
  (this->cursor_visitor_).index_ = 0;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::reset
            (&this->cursor_handler_adaptor_);
  this->eof_ = false;
  iVar1 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(this);
  if ((char)iVar1 != '\0') {
    return;
  }
  (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(this);
  return;
}

Assistant:

void reset()
    {
        parser_.reset();
        cursor_visitor_.reset();
        cursor_handler_adaptor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }